

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surjection_impl.h
# Opt level: O0

int secp256k1_surjection_compute_public_keys
              (secp256k1_gej *pubkeys,size_t n_pubkeys,secp256k1_generator *input_tags,
              size_t n_input_tags,uchar *used_tags,secp256k1_generator *output_tag,
              size_t input_index,size_t *ring_input_index)

{
  undefined1 local_a0 [8];
  secp256k1_ge tmpge;
  size_t j;
  size_t i;
  secp256k1_generator *output_tag_local;
  uchar *used_tags_local;
  size_t n_input_tags_local;
  secp256k1_generator *input_tags_local;
  size_t n_pubkeys_local;
  secp256k1_gej *pubkeys_local;
  
  tmpge.infinity = 0;
  tmpge._84_4_ = 0;
  for (j = 0; j < n_input_tags; j = j + 1) {
    if (((uint)used_tags[j >> 3] & 1 << ((byte)j & 7)) != 0) {
      secp256k1_generator_load((secp256k1_ge *)local_a0,input_tags + j);
      secp256k1_ge_neg((secp256k1_ge *)local_a0,(secp256k1_ge *)local_a0);
      secp256k1_gej_set_ge(pubkeys + tmpge._80_8_,(secp256k1_ge *)local_a0);
      secp256k1_generator_load((secp256k1_ge *)local_a0,output_tag);
      secp256k1_gej_add_ge_var
                (pubkeys + tmpge._80_8_,pubkeys + tmpge._80_8_,(secp256k1_ge *)local_a0,
                 (secp256k1_fe *)0x0);
      if ((ring_input_index != (size_t *)0x0) && (input_index == j)) {
        *ring_input_index = tmpge._80_8_;
      }
      tmpge._80_8_ = tmpge._80_8_ + 1;
    }
  }
  return 1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_surjection_compute_public_keys(secp256k1_gej *pubkeys, size_t n_pubkeys, const secp256k1_generator *input_tags, size_t n_input_tags, const unsigned char *used_tags, const secp256k1_generator *output_tag, size_t input_index, size_t *ring_input_index) {
    size_t i;
    size_t j = 0;
    for (i = 0; i < n_input_tags; i++) {
        if (used_tags[i / 8] & (1 << (i % 8))) {
            secp256k1_ge tmpge;
            secp256k1_generator_load(&tmpge, &input_tags[i]);
            secp256k1_ge_neg(&tmpge, &tmpge);

            VERIFY_CHECK(j < SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS);
            VERIFY_CHECK(j < n_pubkeys);
            secp256k1_gej_set_ge(&pubkeys[j], &tmpge);

            secp256k1_generator_load(&tmpge, output_tag);
            secp256k1_gej_add_ge_var(&pubkeys[j], &pubkeys[j], &tmpge, NULL);
            if (ring_input_index != NULL && input_index == i) {
                *ring_input_index = j;
            }
            j++;
        }
    }
    /* Caller needs to ensure that the number of set bits in used_tags (which we counted in j) equals n_pubkeys. */
    VERIFY_CHECK(j == n_pubkeys);
    return 1;
}